

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sim.cc
# Opt level: O2

void __thiscall eval_bin_op_Test::TestBody(eval_bin_op_Test *this)

{
  size_t sVar1;
  int iVar2;
  result_type rVar3;
  ulong uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  char *pcVar6;
  uint64_t left_value;
  uint64_t right_value;
  ulong uVar7;
  pointer ppVar8;
  long lVar9;
  initializer_list<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_> __l;
  undefined1 local_1628 [8];
  mt19937 rnd;
  AssertionResult gtest_ar;
  undefined1 local_c0 [8];
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  func_map;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  eval_pairs;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> input_pairs;
  AssertHelper local_58;
  _Base_ptr local_50;
  uint64_t local_48;
  uint64_t result;
  long gold;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_1628);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_1628,0x2a);
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             &eval_pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x1a4,(allocator_type *)&rnd._M_p);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            *)&func_map._M_t._M_impl.super__Rb_tree_header._M_node_count,0x1a4,
           (allocator_type *)&rnd._M_p);
  for (lVar9 = 0; lVar9 != 0x1a4; lVar9 = lVar9 + 1) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)local_1628);
    uVar7 = rVar3 % 0x3ff - 0x1ff;
    uVar5 = 0;
    uVar4 = 0;
    while (uVar5 == 0) {
      rVar3 = std::
              mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              ::operator()((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                            *)local_1628);
      uVar5 = rVar3 % 0x3ff - 0x1ff;
      uVar4 = uVar5 & 0x3ff;
    }
    eval_pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar9].first = uVar7;
    eval_pairs.
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage[lVar9].second = uVar5;
    *(ulong *)(func_map._M_t._M_impl.super__Rb_tree_header._M_node_count + lVar9 * 0x10) =
         uVar7 & 0x3ff;
    *(ulong *)(func_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 8 + lVar9 * 0x10) = uVar4
    ;
  }
  rnd._M_p = 7;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  __l._M_len = 0xc;
  __l._M_array = (iterator)&rnd._M_p;
  std::
  map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  ::map((map<kratos::ExprOp,_std::function<long_(long,_long)>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
         *)local_c0,__l,(less<kratos::ExprOp> *)&result,(allocator_type *)&local_48);
  lVar9 = 0x1c0;
  do {
    std::_Function_base::~_Function_base((_Function_base *)((long)&rnd._M_p + lVar9));
    lVar9 = lVar9 + -0x28;
  } while (lVar9 != -0x20);
  while (func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)&func_map) {
    lVar9 = 8;
    local_50 = func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (uVar4 = 0; sVar1 = func_map._M_t._M_impl.super__Rb_tree_header._M_node_count,
        ppVar8 = eval_pairs.
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
        uVar4 < (ulong)((long)input_pairs.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start -
                        (long)eval_pairs.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage >> 4);
        uVar4 = uVar4 + 1) {
      result = std::function<long_(long,_long)>::operator()
                         ((function<long_(long,_long)> *)
                          &func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent[1].
                           _M_parent,
                          *(long *)((long)eval_pairs.
                                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                   lVar9 + -8),
                          *(long *)((long)&(eval_pairs.
                                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           first + lVar9));
      local_48 = kratos::eval_bin_op(*(uint64_t *)((sVar1 - 8) + lVar9),*(uint64_t *)(sVar1 + lVar9)
                                     ,(ExprOp)*(_Base_ptr *)(local_50 + 1),10,true);
      if (0x3ff < result) {
        result = (uint64_t)((uint)result & 0x3ff);
      }
      testing::internal::CmpHelperEQ<long,unsigned_long>
                ((internal *)&rnd._M_p,"gold","result",(long *)&result,&local_48);
      if ((char)rnd._M_p == '\0') {
        testing::Message::Message((Message *)&gold);
        pcVar6 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar6 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc"
                   ,0x11c,pcVar6);
        testing::internal::AssertHelper::operator=(&local_58,(Message *)&gold);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if (gold != 0) {
          (**(code **)(*(long *)gold + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&gtest_ar);
      lVar9 = lVar9 + 0x10;
    }
    for (; ppVar8 != (pointer)input_pairs.
                              super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppVar8 = ppVar8 + 1) {
      right_value = ppVar8->second + 0x1ff;
      if (right_value != 0) {
        left_value = ppVar8->first + 0x1ff;
        pcVar6 = (char *)std::function<long_(long,_long)>::operator()
                                   ((function<long_(long,_long)> *)
                                    &func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                     [1]._M_parent,left_value,right_value);
        iVar2 = kratos::truncate(pcVar6,10);
        result = CONCAT44(extraout_var,iVar2);
        local_48 = kratos::eval_bin_op(left_value,right_value,*(ExprOp *)(local_50 + 1),10,false);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  ((internal *)&rnd._M_p,"gold","result",&result,&local_48);
        if ((char)rnd._M_p == '\0') {
          testing::Message::Message((Message *)&gold);
          pcVar6 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar6 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_58,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_sim.cc"
                     ,0x127,pcVar6);
          testing::internal::AssertHelper::operator=(&local_58,(Message *)&gold);
          testing::internal::AssertHelper::~AssertHelper(&local_58);
          if (gold != 0) {
            (**(code **)(*(long *)gold + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&gtest_ar);
      }
    }
    func_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)std::_Rb_tree_increment(local_50);
  }
  std::
  _Rb_tree<kratos::ExprOp,_std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>,_std::_Select1st<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
  ::~_Rb_tree((_Rb_tree<kratos::ExprOp,_std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>,_std::_Select1st<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>,_std::less<kratos::ExprOp>,_std::allocator<std::pair<const_kratos::ExprOp,_std::function<long_(long,_long)>_>_>_>
               *)local_c0);
  std::
  _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   *)&func_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~_Vector_base
            ((_Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
             &eval_pairs.
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(eval, bin_op) {  // NOLINT
    size_t seed = 42;
    std::mt19937 rnd;  // NOLINT
    rnd.seed(seed);
    auto constexpr width = 10;
    auto constexpr mask = UINT64_MASK >> (64u - width);
    auto constexpr num_test = 420u;
    std::vector<std::pair<int64_t, int64_t>> input_pairs(num_test);
    std::vector<std::pair<uint64_t, uint64_t>> eval_pairs(num_test);
    for (uint32_t i = 0; i < num_test; i++) {
        int64_t value1_ = static_cast<int64_t>(rnd() % mask) - mask / 2;
        uint64_t value1 = *(reinterpret_cast<uint64_t *>(&value1_)) & mask;
        int64_t value2_ = 0;
        uint64_t value2 = 0;
        while (value2_ == 0) {
            value2_ = static_cast<int64_t>(rnd() % mask) - mask / 2;
            value2 = *(reinterpret_cast<uint64_t *>(&value2_)) & mask;
        }
        input_pairs[i] = {value1_, value2_};
        eval_pairs[i] = {value1, value2};
    }

    std::map<ExprOp, std::function<int64_t(int64_t, int64_t)>> func_map = {
        {ExprOp::Add, [](int64_t value1, int64_t value2) { return value1 + value2; }},
        {ExprOp::Minus, [](int64_t value1, int64_t value2) { return value1 - value2; }},
        {ExprOp::Multiply, [](int64_t value1, int64_t value2) { return value1 * value2; }},
        {ExprOp::Divide, [](int64_t value1, int64_t value2) { return value1 / value2; }},
        {ExprOp::And, [](int64_t value1, int64_t value2) { return value1 & value2; }},  // NOLINT
        {ExprOp::Or, [](int64_t value1, int64_t value2) { return value1 | value2; }},   // NOLINT
        {ExprOp::Xor, [](int64_t value1, int64_t value2) { return value1 ^ value2; }},  // NOLINT
        {ExprOp::Eq, [](int64_t value1, int64_t value2) { return value1 == value2; }},
        {ExprOp::GreaterEqThan, [](int64_t value1, int64_t value2) { return value1 >= value2; }},
        {ExprOp::GreaterThan, [](int64_t value1, int64_t value2) { return value1 > value2; }},
        {ExprOp::LessEqThan, [](int64_t value1, int64_t value2) { return value1 <= value2; }},
        {ExprOp::LessThan, [](int64_t value1, int64_t value2) { return value1 < value2; }}};

    for (auto const &[op, func] : func_map) {
        // signed
        for (uint64_t i = 0; i < input_pairs.size(); i++) {
            auto const &[v1_, v2_] = input_pairs[i];
            auto const &[v1, v2] = eval_pairs[i];
            auto gold = func(v1_, v2_);
            auto result = eval_bin_op(v1, v2, op, width, true);
            if (gold < 0 || static_cast<uint64_t>(abs(gold)) > mask) {
                gold = (*reinterpret_cast<uint64_t *>(&gold)) & mask;
            }
            EXPECT_EQ(gold, result);
        }
        // unsigned
        for (auto [v1_, v2_] : input_pairs) {
            v1_ += mask / 2;
            v2_ += mask / 2;
            auto v1 = static_cast<uint64_t>(v1_);
            auto v2 = static_cast<uint64_t>(v2_);
            if (v2 == 0) continue;
            auto gold = truncate(func(v1_, v2_), width);
            auto result = eval_bin_op(v1, v2, op, width, false);
            EXPECT_EQ(gold, result);
        }
    }
}